

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  Curl_multi *pCVar1;
  conncache *local_50;
  conncache *local_48;
  long local_38;
  connfind find;
  connectdata *c;
  connectdata **connp_local;
  Curl_easy *data_local;
  
  if (((data->state).lastconnect_id == -1) ||
     ((data->multi_easy == (Curl_multi *)0x0 && (data->multi == (Curl_multi *)0x0)))) {
    data_local._4_4_ = -1;
  }
  else {
    local_38 = (data->state).lastconnect_id;
    find.id_tofind = 0;
    if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x20) == 0)) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        pCVar1 = data->multi;
      }
      else {
        pCVar1 = data->multi_easy;
      }
      local_50 = &pCVar1->conn_cache;
      local_48 = local_50;
    }
    else {
      local_48 = &data->share->conn_cache;
    }
    Curl_conncache_foreach(data,local_48,&local_38,conn_is_conn);
    if (find.id_tofind == 0) {
      (data->state).lastconnect_id = -1;
      data_local._4_4_ = -1;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = (connectdata *)find.id_tofind;
      }
      data_local._4_4_ = *(curl_socket_t *)(find.id_tofind + 0x1e0);
    }
  }
  return data_local._4_4_;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if((data->state.lastconnect_id != -1) && (data->multi_easy || data->multi)) {
    struct connectdata *c;
    struct connfind find;
    find.id_tofind = data->state.lastconnect_id;
    find.found = NULL;

    Curl_conncache_foreach(data,
                           data->share && (data->share->specifier
                           & (1<< CURL_LOCK_DATA_CONNECT))?
                           &data->share->conn_cache:
                           data->multi_easy?
                           &data->multi_easy->conn_cache:
                           &data->multi->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect_id = -1;
      return CURL_SOCKET_BAD;
    }

    c = find.found;
    if(connp)
      /* only store this if the caller cares for it */
      *connp = c;
    return c->sock[FIRSTSOCKET];
  }
  return CURL_SOCKET_BAD;
}